

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.cpp
# Opt level: O1

shared_ptr<BER_CONTAINER> __thiscall OpaqueCallback::buildTypeWithValue(OpaqueCallback *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long in_RSI;
  shared_ptr<BER_CONTAINER> sVar1;
  undefined1 local_29;
  OpaqueType *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  if (*(long *)(in_RSI + 0x18) == 0) {
    (this->super_ValueCallback)._vptr_ValueCallback = (_func_int **)0x0;
    (this->super_ValueCallback).OID = (SortableOIDType *)0x0;
  }
  else {
    local_28 = (OpaqueType *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<OpaqueType,std::allocator<OpaqueType>,unsigned_char*const&,int_const&>
              (&local_20,&local_28,(allocator<OpaqueType> *)&local_29,(uchar **)(in_RSI + 0x18),
               (int *)(in_RSI + 0x20));
    (this->super_ValueCallback)._vptr_ValueCallback = (_func_int **)local_28;
    (this->super_ValueCallback).OID = (SortableOIDType *)0x0;
    (this->super_ValueCallback).OID = (SortableOIDType *)local_20._M_pi;
    in_RDX._M_pi = extraout_RDX;
  }
  sVar1.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar1.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<BER_CONTAINER>)
         sVar1.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BER_CONTAINER> OpaqueCallback::buildTypeWithValue(){
    ASSERT_VALID_VALUE(this->value);

    return std::make_shared<OpaqueType>(this->value, this->data_len);
}